

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask.c
# Opt level: O1

void aom_highbd_blend_a64_d16_mask_c
               (uint8_t *dst_8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint32_t uVar9;
  int iVar10;
  int iVar11;
  
  cVar2 = (char)conv_params->round_1 + (char)conv_params->round_0;
  cVar1 = (char)bd - cVar2;
  iVar7 = (-1 << (cVar1 + 0xdU & 0x1f)) + (-1 << (cVar1 + 0xeU & 0x1f));
  bVar5 = 0xe - cVar2;
  lVar8 = (long)dst_8 * 2;
  iVar10 = 0xff;
  if (bd == 10) {
    iVar10 = 0x3ff;
  }
  iVar11 = 0xfff;
  if (bd != 0xc) {
    iVar11 = iVar10;
  }
  if (subh == 0 && subw == 0) {
    if (0 < h) {
      iVar10 = 0;
      do {
        if (0 < w) {
          uVar6 = 0;
          do {
            iVar4 = ((int)((uint)src1[uVar6] * (0x40 - (uint)mask[uVar6]) +
                          (uint)src0[uVar6] * (uint)mask[uVar6]) >> 6) +
                    iVar7 + ((1 << (bVar5 & 0x1f)) >> 1);
            if (iVar4 >> (bVar5 & 0x1f) < 1) {
              iVar4 = 0;
            }
            iVar4 = iVar4 >> (bVar5 & 0x1f);
            if (iVar11 <= iVar4) {
              iVar4 = iVar11;
            }
            *(short *)(lVar8 + uVar6 * 2) = (short)iVar4;
            uVar6 = uVar6 + 1;
          } while ((uint)w != uVar6);
        }
        mask = mask + mask_stride;
        iVar10 = iVar10 + 1;
        lVar8 = lVar8 + (ulong)dst_stride * 2;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      } while (iVar10 != h);
    }
  }
  else if (subh == 1 && (subw ^ 1U) == 0) {
    if (0 < h) {
      iVar10 = 0;
      do {
        if (0 < w) {
          uVar6 = 0;
          uVar9 = mask_stride;
          do {
            uVar3 = (uint)mask[uVar9 + 1] +
                    (uint)mask[uVar6 * 2 + 1] + (uint)mask[uVar6 * 2] + (uint)mask[uVar9] + 2 >> 2;
            iVar4 = ((int)((uint)src1[uVar6] * (0x40 - uVar3) + src0[uVar6] * uVar3) >> 6) +
                    iVar7 + ((1 << (bVar5 & 0x1f)) >> 1);
            if (iVar4 >> (bVar5 & 0x1f) < 1) {
              iVar4 = 0;
            }
            iVar4 = iVar4 >> (bVar5 & 0x1f);
            if (iVar11 <= iVar4) {
              iVar4 = iVar11;
            }
            *(short *)(lVar8 + uVar6 * 2) = (short)iVar4;
            uVar6 = uVar6 + 1;
            uVar9 = uVar9 + 2;
          } while ((uint)w != uVar6);
        }
        mask = mask + mask_stride * 2;
        iVar10 = iVar10 + 1;
        lVar8 = lVar8 + (ulong)dst_stride * 2;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      } while (iVar10 != h);
    }
  }
  else if ((subw ^ 1U) == 0 && subh == 0) {
    if (0 < h) {
      iVar10 = 0;
      do {
        if (0 < w) {
          uVar6 = 0;
          do {
            uVar3 = (uint)mask[uVar6 * 2 + 1] + (uint)mask[uVar6 * 2] + 1 >> 1 & 0xff;
            iVar4 = ((int)((uint)src1[uVar6] * (0x40 - uVar3) + src0[uVar6] * uVar3) >> 6) +
                    iVar7 + ((1 << (bVar5 & 0x1f)) >> 1);
            if (iVar4 >> (bVar5 & 0x1f) < 1) {
              iVar4 = 0;
            }
            iVar4 = iVar4 >> (bVar5 & 0x1f);
            if (iVar11 <= iVar4) {
              iVar4 = iVar11;
            }
            *(short *)(lVar8 + uVar6 * 2) = (short)iVar4;
            uVar6 = uVar6 + 1;
          } while ((uint)w != uVar6);
        }
        mask = mask + mask_stride;
        iVar10 = iVar10 + 1;
        lVar8 = lVar8 + (ulong)dst_stride * 2;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      } while (iVar10 != h);
    }
  }
  else if (0 < h) {
    iVar10 = 0;
    do {
      if (0 < w) {
        uVar6 = 0;
        do {
          uVar3 = (uint)mask[uVar6] + (uint)mask[mask_stride + (int)uVar6] + 1 >> 1 & 0xff;
          iVar4 = ((int)((uint)src1[uVar6] * (0x40 - uVar3) + src0[uVar6] * uVar3) >> 6) +
                  iVar7 + ((1 << (bVar5 & 0x1f)) >> 1);
          if (iVar4 >> (bVar5 & 0x1f) < 1) {
            iVar4 = 0;
          }
          iVar4 = iVar4 >> (bVar5 & 0x1f);
          if (iVar11 <= iVar4) {
            iVar4 = iVar11;
          }
          *(short *)(lVar8 + uVar6 * 2) = (short)iVar4;
          uVar6 = uVar6 + 1;
        } while ((uint)w != uVar6);
      }
      mask = mask + mask_stride * 2;
      iVar10 = iVar10 + 1;
      lVar8 = lVar8 + (ulong)dst_stride * 2;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    } while (iVar10 != h);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_c(
    uint8_t *dst_8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  // excerpt from clip_pixel_highbd()
  // set saturation_value to (1 << bd) - 1
  unsigned int saturation_value;
  switch (bd) {
    case 8:
    default: saturation_value = 255; break;
    case 10: saturation_value = 1023; break;
    case 12: saturation_value = 4095; break;
  }

  if (subw == 0 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = mask[j];
        res = ((m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
               AOM_BLEND_A64_ROUND_BITS);
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 1) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = ROUND_POWER_OF_TWO(
            mask[2 * j] + mask[mask_stride + 2 * j] + mask[2 * j + 1] +
                mask[mask_stride + 2 * j + 1],
            2);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else if (subw == 1 && subh == 0) {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[2 * j], mask[2 * j + 1]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  } else {
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        int32_t res;
        const int m = AOM_BLEND_AVG(mask[j], mask[mask_stride + j]);
        res = (m * src0[j] + (AOM_BLEND_A64_MAX_ALPHA - m) * src1[j]) >>
              AOM_BLEND_A64_ROUND_BITS;
        res -= round_offset;
        unsigned int v = negative_to_zero(ROUND_POWER_OF_TWO(res, round_bits));
        dst[j] = AOMMIN(v, saturation_value);
      }
      mask += 2 * mask_stride;
      src0 += src0_stride;
      src1 += src1_stride;
      dst += dst_stride;
    }
  }
}